

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::SetColumnOffset(int column_index,float offset)

{
  float fVar1;
  ImGuiColumns *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImGuiColumnData *pIVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  
  while( true ) {
    pIVar4 = GImGui;
    pIVar2 = (GImGui->CurrentWindow->DC).CurrentColumns;
    if (pIVar2 == (ImGuiColumns *)0x0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1d89,"SetColumnOffset","ImGui ASSERT FAILED: %s","columns != NULL");
    }
    if (column_index < 0) {
      column_index = pIVar2->Current;
    }
    if ((pIVar2->Columns).Size <= column_index) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1d8d,"SetColumnOffset","ImGui ASSERT FAILED: %s",
                  "column_index < columns->Columns.Size");
    }
    uVar9 = pIVar2->Flags;
    fVar11 = 0.0;
    if (((uVar9 & 4) == 0) && (column_index < pIVar2->Count + -1)) {
      iVar8 = column_index;
      if (column_index < 0) {
        iVar8 = pIVar2->Current;
      }
      iVar7 = iVar8 + 1;
      iVar5 = (pIVar2->Columns).Size;
      if (pIVar2->IsBeingResized == false) {
        if (iVar5 <= iVar7) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          iVar5 = (pIVar2->Columns).Size;
        }
        pIVar6 = (pIVar2->Columns).Data;
        fVar11 = pIVar6[iVar7].OffsetNorm;
        if (iVar5 <= iVar8) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          pIVar6 = (pIVar2->Columns).Data;
        }
        pIVar6 = pIVar6 + iVar8;
      }
      else {
        if (iVar5 <= iVar7) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          iVar5 = (pIVar2->Columns).Size;
        }
        pIVar6 = (pIVar2->Columns).Data;
        fVar11 = pIVar6[iVar7].OffsetNormBeforeResize;
        if (iVar5 <= iVar8) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          pIVar6 = (pIVar2->Columns).Data;
        }
        pIVar6 = (ImGuiColumnData *)&pIVar6[iVar8].OffsetNormBeforeResize;
      }
      fVar11 = (pIVar2->OffMaxX - pIVar2->OffMinX) * (fVar11 - pIVar6->OffsetNorm);
      uVar9 = pIVar2->Flags;
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    fVar1 = pIVar2->OffMaxX;
    if (((uVar9 & 8) == 0) &&
       (fVar10 = fVar1 - (float)(pIVar2->Count - column_index) * (pIVar4->Style).ColumnsMinSpacing,
       fVar10 <= offset)) {
      offset = fVar10;
    }
    fVar10 = pIVar2->OffMinX;
    if ((pIVar2->Columns).Size <= column_index) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    (pIVar2->Columns).Data[column_index].OffsetNorm = (offset - fVar10) / (fVar1 - fVar10);
    if (!bVar3) break;
    column_index = column_index + 1;
    fVar1 = (pIVar4->Style).ColumnsMinSpacing;
    uVar9 = -(uint)(fVar11 <= fVar1);
    offset = offset + (float)(~uVar9 & (uint)fVar11 | (uint)fVar1 & uVar9);
  }
  return;
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiColumnsFlags_NoPreserveWidths) && (column_index < columns->Count - 1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiColumnsFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}